

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_utils.cpp
# Opt level: O3

bool FileSysUtilsGetParentPath(string *file_path,string *parent_path)

{
  bool bVar1;
  long lVar2;
  string full_path;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  bVar1 = FileSysUtilsGetCanonicalPath(file_path,&local_68);
  if (bVar1) {
    lVar2 = std::__cxx11::string::rfind((char)&local_68,0x2f);
    if (lVar2 == 0) {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_48,local_68._M_dataplus._M_p,
                 local_68._M_dataplus._M_p + local_68._M_string_length);
    }
    else {
      std::__cxx11::string::substr((ulong)local_48,(ulong)&local_68);
    }
    std::__cxx11::string::operator=((string *)parent_path,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool FileSysUtilsGetParentPath(const std::string& file_path, std::string& parent_path) {
    std::string full_path;
    if (FileSysUtilsGetAbsolutePath(file_path, full_path)) {
        std::string::size_type lastSeparator = full_path.find_last_of(DIRECTORY_SYMBOL);
        parent_path = (lastSeparator == 0) ? full_path : full_path.substr(0, lastSeparator);
        return true;
    }
    return false;
}